

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O0

gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>::gc_table> __thiscall
mjs::gc_vector<const_mjs::function_definition_*>::gc_table::copy_with_increased_capacity
          (gc_table *this,uint32_t new_capacity)

{
  uint32_t uVar1;
  gc_heap *h;
  gc_table *pgVar2;
  function_definition **__dest;
  function_definition **__src;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  gc_table *this_00;
  gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>::gc_table> gVar3;
  uint32_t new_capacity_local;
  gc_table *this_local;
  gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>::gc_table> *nt;
  
  this_00 = (gc_table *)CONCAT44(in_register_00000034,new_capacity);
  uVar1 = length(this_00);
  if (in_EDX < uVar1) {
    __assert_fail("new_capacity >= length()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                  ,0x6a,
                  "gc_heap_ptr<gc_table> mjs::gc_vector<const mjs::function_definition *>::gc_table::copy_with_increased_capacity(uint32_t) const [T = const mjs::function_definition *]"
                 );
  }
  h = heap(this_00);
  make<>(this,h,in_EDX);
  pgVar2 = gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>::gc_table>::operator->
                     ((gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>::gc_table> *)
                      this);
  uVar1 = length(this_00);
  length(pgVar2,uVar1);
  pgVar2 = gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>::gc_table>::operator->
                     ((gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>::gc_table> *)
                      this);
  __dest = entries(pgVar2);
  __src = entries(this_00);
  uVar1 = length(this_00);
  memcpy(__dest,__src,(ulong)uVar1 << 3);
  gVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  gVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::gc_vector<const_mjs::function_definition_*>::gc_table>)
         gVar3.super_gc_heap_ptr_untyped;
}

Assistant:

[[nodiscard]] gc_heap_ptr<gc_table> copy_with_increased_capacity(uint32_t new_capacity) const {
            assert(new_capacity >= length());
            auto nt = make(heap(), new_capacity);
            nt->length(length());
            // Since it's the same heap the representation can just be copied
            std::memcpy(nt->entries(), entries(), length() * sizeof(T));
            return nt;
        }